

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderMatrixTests.cpp
# Opt level: O3

void vkt::sr::anon_unknown_0::MatrixCaseUtils::Evaluator<3,_11,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  bool bVar4;
  long lVar5;
  float *pfVar6;
  float *pfVar7;
  int col;
  long lVar8;
  int col_1;
  float fVar9;
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  float local_68 [8];
  undefined8 local_48;
  float local_40;
  Type in0;
  int aiStack_18 [6];
  
  pfVar7 = in0.m_data.m_data[0].m_data + 1;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        fVar9 = 1.0;
        if (lVar5 != lVar8) {
          fVar9 = 0.0;
        }
        pfVar6[lVar8 * 2] = fVar9;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 1;
      pfVar6 = pfVar7;
      bVar3 = false;
    } while (bVar4);
    in0.m_data.m_data[0].m_data[0] = evalCtx->in[0].m_data[0];
    in0.m_data.m_data[0].m_data[1] = evalCtx->in[0].m_data[1];
    in0.m_data.m_data[1].m_data[0] = evalCtx->in[1].m_data[0];
    in0.m_data.m_data[1].m_data[1] = evalCtx->in[1].m_data[1];
    in0.m_data.m_data[2].m_data[0] = evalCtx->in[2].m_data[0];
    in0.m_data.m_data[2].m_data[1] = evalCtx->in[2].m_data[1];
    in0.m_data.m_data[3].m_data[0] = evalCtx->in[3].m_data[0];
    in0.m_data.m_data[3].m_data[1] = evalCtx->in[3].m_data[1];
  }
  else {
    in0.m_data.m_data[2].m_data[0] = 0.0;
    in0.m_data.m_data[2].m_data[1] = 0.0;
    in0.m_data.m_data[3].m_data[0] = 0.0;
    in0.m_data.m_data[3].m_data[1] = 0.0;
    in0.m_data.m_data[0].m_data[0] = 0.0;
    in0.m_data.m_data[0].m_data[1] = 0.0;
    in0.m_data.m_data[1].m_data[0] = 0.0;
    in0.m_data.m_data[1].m_data[1] = 0.0;
    lVar5 = 0;
    pfVar6 = (float *)&in0;
    bVar3 = true;
    do {
      bVar4 = bVar3;
      lVar8 = 0;
      do {
        pfVar6[lVar8 * 2] =
             *(float *)((long)&sr::(anonymous_namespace)::s_constInMat4x2 + lVar5 + lVar8 * 4);
        lVar8 = lVar8 + 1;
      } while (lVar8 != 4);
      lVar5 = 0x10;
      pfVar6 = pfVar7;
      bVar3 = false;
    } while (bVar4);
  }
  fVar9 = (evalCtx->coords).m_data[0];
  lVar5 = 0;
  pfVar7 = local_68;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar8 = 0;
    do {
      fVar11 = 1.0;
      if (lVar5 != lVar8) {
        fVar11 = 0.0;
      }
      pfVar7[lVar8 * 2] = fVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    lVar5 = 1;
    pfVar7 = local_68 + 1;
    bVar3 = false;
  } while (bVar4);
  if (in1Type != INPUTTYPE_DYNAMIC) {
    fVar9 = -0.2;
  }
  auVar1._4_4_ = in0.m_data.m_data[0].m_data[1];
  auVar1._0_4_ = in0.m_data.m_data[0].m_data[0];
  auVar1._8_4_ = in0.m_data.m_data[1].m_data[0];
  auVar1._12_4_ = in0.m_data.m_data[1].m_data[1];
  auVar2._4_4_ = in0.m_data.m_data[2].m_data[1];
  auVar2._0_4_ = in0.m_data.m_data[2].m_data[0];
  auVar2._8_4_ = in0.m_data.m_data[3].m_data[0];
  auVar2._12_4_ = in0.m_data.m_data[3].m_data[1];
  auVar10._4_4_ = fVar9;
  auVar10._0_4_ = fVar9;
  auVar10._8_4_ = fVar9;
  auVar10._12_4_ = fVar9;
  auVar10 = divps(auVar1,auVar10);
  auVar12._4_4_ = fVar9;
  auVar12._0_4_ = fVar9;
  auVar12._8_4_ = fVar9;
  auVar12._12_4_ = fVar9;
  auVar12 = divps(auVar2,auVar12);
  local_68[4] = auVar12._0_4_;
  local_68[5] = auVar12._4_4_;
  local_68[3] = auVar10._12_4_;
  local_48 = CONCAT44(auVar12._12_4_ + local_68[3] + auVar10._8_4_,
                      auVar12._8_4_ + auVar10._0_4_ + auVar10._4_4_);
  local_40 = local_68[4] + local_68[5];
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar5 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar5]] = local_68[lVar5 + 6];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 / in1);
	}